

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_iterative.c
# Opt level: O0

SUNErrCode SUNQRAdd_MGS(N_Vector *Q,sunrealtype *R,N_Vector df,int m,int mMax,void *QRdata)

{
  sunrealtype sVar1;
  int in_ECX;
  long in_RSI;
  long *in_RDI;
  int in_R8D;
  N_Vector in_R9;
  SUNQRData qrdata;
  sunindextype j;
  SUNContext sunctx_local_scope_;
  N_Vector in_stack_ffffffffffffffb8;
  N_Vector p_Var2;
  sunrealtype sVar3;
  
  sVar3 = *(sunrealtype *)(*in_RDI + 0x10);
  N_VScale((sunrealtype)in_R9,in_stack_ffffffffffffffb8,(N_Vector)0x10b406);
  for (p_Var2 = (N_Vector)0x0; (long)p_Var2 < (long)in_ECX;
      p_Var2 = (N_Vector)((long)&p_Var2->content + 1)) {
    sVar1 = N_VDotProd(in_R9,in_stack_ffffffffffffffb8);
    *(sunrealtype *)(in_RSI + ((long)&p_Var2->content + (long)(in_ECX * in_R8D)) * 8) = sVar1;
    N_VLinearSum(sVar3,p_Var2,(sunrealtype)in_R9,in_stack_ffffffffffffffb8,(N_Vector)0x10b4b5);
  }
  sVar3 = N_VDotProd(in_R9,in_stack_ffffffffffffffb8);
  *(sunrealtype *)(in_RSI + (long)(in_ECX * in_R8D + in_ECX) * 8) = sVar3;
  if (0.0 < *(double *)(in_RSI + (long)(in_ECX * in_R8D + in_ECX) * 8)) {
    p_Var2 = (N_Vector)sqrt(*(double *)(in_RSI + (long)(in_ECX * in_R8D + in_ECX) * 8));
  }
  else {
    p_Var2 = (N_Vector)0x0;
  }
  *(N_Vector *)(in_RSI + (long)(in_ECX * in_R8D + in_ECX) * 8) = p_Var2;
  N_VScale((sunrealtype)in_R9,p_Var2,(N_Vector)0x10b5a0);
  return 0;
}

Assistant:

SUNErrCode SUNQRAdd_MGS(N_Vector* Q, sunrealtype* R, N_Vector df, int m,
                        int mMax, void* QRdata)
{
  SUNFunctionBegin(Q[0]->sunctx);

  sunindextype j;
  SUNQRData qrdata = (SUNQRData)QRdata;

  N_VScale(ONE, df, qrdata->vtemp);
  SUNCheckLastErr();
  for (j = 0; j < m; j++)
  {
    R[m * mMax + j] = N_VDotProd(Q[j], qrdata->vtemp);
    SUNCheckLastErr();
    N_VLinearSum(ONE, qrdata->vtemp, -R[m * mMax + j], Q[j], qrdata->vtemp);
    SUNCheckLastErr();
  }
  R[m * mMax + m] = N_VDotProd(qrdata->vtemp, qrdata->vtemp);
  SUNCheckLastErr();
  R[m * mMax + m] = SUNRsqrt(R[m * mMax + m]);
  N_VScale((1 / R[m * mMax + m]), qrdata->vtemp, Q[m]);
  SUNCheckLastErr();

  return SUN_SUCCESS;
}